

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_test.cc
# Opt level: O0

void __thiscall xLearn::F1MetricTest_f1_test_Test::TestBody(F1MetricTest_f1_test_Test *this)

{
  bool bVar1;
  uint uVar2;
  void *pvVar3;
  char *pcVar4;
  reference pvVar5;
  real_t rVar6;
  vector<float,_std::allocator<float>_> *in_stack_00000060;
  vector<float,_std::allocator<float>_> *in_stack_00000068;
  F1Metric *in_stack_00000070;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  real_t metric_val;
  ThreadPool *pool;
  size_t threadNumber;
  F1Metric metric;
  vector<float,_std::allocator<float>_> pred;
  vector<float,_std::allocator<float>_> Y;
  float in_stack_00000218;
  float in_stack_0000021c;
  char *in_stack_00000220;
  char *in_stack_00000228;
  value_type_conflict *in_stack_fffffffffffffe58;
  F1Metric *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 uVar7;
  F1Metric *this_00;
  size_t in_stack_fffffffffffffe98;
  size_type __n;
  ThreadPool *in_stack_fffffffffffffea0;
  vector<float,_std::allocator<float>_> *this_01;
  AssertHelper local_128;
  Message local_120;
  string local_118 [32];
  ThreadPool *in_stack_ffffffffffffff08;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff10;
  AssertHelper local_e8;
  Message local_e0;
  AssertionResult local_d8;
  AssertHelper local_c8;
  Message local_c0;
  AssertionResult local_b8;
  real_t local_a4;
  void *local_a0;
  ulong local_98;
  F1Metric local_90;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  vector<float,_std::allocator<float>_> local_58;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_24;
  vector<float,_std::allocator<float>_> local_20;
  
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x17da71);
  local_24 = 0x3f800000;
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe58);
  local_38 = 0x3f800000;
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe58);
  local_3c = 0xbf800000;
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe58);
  local_40 = 0xbf800000;
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe58);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x17db08);
  local_5c = 0x42c80000;
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe58);
  local_60 = 0x42000000;
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe58);
  local_64 = 0x41400000;
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe58);
  local_68 = 0xc1a80000;
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe58);
  F1Metric::F1Metric(in_stack_fffffffffffffe60);
  uVar2 = std::thread::hardware_concurrency();
  local_98 = (ulong)uVar2;
  pvVar3 = operator_new(0x120);
  ThreadPool::ThreadPool(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  local_a0 = pvVar3;
  Metric::Initialize((Metric *)in_stack_ffffffffffffff10.ptr_,in_stack_ffffffffffffff08);
  F1Metric::Accumulate(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  local_a4 = F1Metric::GetMetric(&local_90);
  testing::internal::CmpHelperFloatingPointEQ<float>
            (in_stack_00000228,in_stack_00000220,in_stack_0000021c,in_stack_00000218);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x17dd2d);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric_test.cc"
               ,0x93,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x17dd8a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17dde2);
  F1Metric::Reset(&local_90);
  this_01 = &local_20;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](this_01,0);
  *pvVar5 = 1.0;
  this_00 = (F1Metric *)0x1;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](this_01,1);
  *pvVar5 = -1.0;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](this_01,2);
  *pvVar5 = 1.0;
  __n = 3;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](this_01,3);
  *pvVar5 = -1.0;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](&local_58,0);
  *pvVar5 = 12.0;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](&local_58,(size_type)this_00);
  *pvVar5 = 12.0;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](&local_58,2);
  *pvVar5 = -12.0;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](&local_58,__n);
  *pvVar5 = -12.0;
  F1Metric::Accumulate(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  rVar6 = F1Metric::GetMetric(&local_90);
  local_a4 = rVar6;
  testing::internal::CmpHelperFloatingPointEQ<float>
            (in_stack_00000228,in_stack_00000220,in_stack_0000021c,in_stack_00000218);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
  uVar7 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe78);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    in_stack_fffffffffffffe70 =
         (vector<float,_std::allocator<float>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x17df90);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric_test.cc"
               ,0x9f,(char *)in_stack_fffffffffffffe70);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message((Message *)0x17dfed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17e042);
  F1Metric::metric_type_abi_cxx11_(this_00);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[3]>
            ((char *)CONCAT44(rVar6,uVar7),(char *)in_stack_fffffffffffffe70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
             (char (*) [3])in_stack_fffffffffffffe60);
  std::__cxx11::string::~string(local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff08);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x17e121);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric_test.cc"
               ,0xa0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::Message::~Message((Message *)0x17e17e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17e1d3);
  F1Metric::~F1Metric((F1Metric *)0x17e1e0);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffe70);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffe70);
  return;
}

Assistant:

TEST(F1MetricTest, f1_test) {
  std::vector<real_t> Y;
  Y.push_back(1.0);
  Y.push_back(1.0);
  Y.push_back(-1.0);
  Y.push_back(-1.0);
  std::vector<real_t> pred;
  pred.push_back(100);
  pred.push_back(32);
  pred.push_back(12);
  pred.push_back(-21);
  F1Metric metric;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  metric.Initialize(pool);
  metric.Accumulate(Y, pred);
  real_t metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, (4.0 / 5.0));
  metric.Reset();
  Y[0] = 1.0;
  Y[1] = -1.0;
  Y[2] = 1.0;
  Y[3] = -1.0;
  pred[0] = 12;
  pred[1] = 12;
  pred[2] = -12;
  pred[3] = -12;
  metric.Accumulate(Y, pred);
  metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, (2.0 / 4.0));
  EXPECT_EQ(metric.metric_type(), "F1");
}